

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

UBool __thiscall
icu_63::Edits::Iterator::next(Iterator *this,UBool onlyChanges,UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int32_t num_1;
  int32_t num;
  int32_t newLen;
  int32_t oldLen;
  int32_t u;
  UErrorCode *errorCode_local;
  UBool onlyChanges_local;
  Iterator *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    if (this->dir < '\x01') {
      if ((this->dir < '\0') && (0 < this->remaining)) {
        this->index = this->index + 1;
        this->dir = '\x01';
        return '\x01';
      }
      this->dir = '\x01';
    }
    else {
      updateNextIndexes(this);
    }
    if (0 < this->remaining) {
      if (1 < this->remaining) {
        this->remaining = this->remaining + -1;
        return '\x01';
      }
      this->remaining = 0;
    }
    if (this->index < this->length) {
      iVar6 = this->index;
      this->index = iVar6 + 1;
      newLen = (int32_t)this->array[iVar6];
      if ((uint)newLen < 0x1000) {
        this->changed = '\0';
        this->oldLength_ = newLen + 1;
        while( true ) {
          bVar1 = false;
          if (this->index < this->length) {
            newLen = (int32_t)this->array[this->index];
            bVar1 = this->array[this->index] < 0x1000;
          }
          if (!bVar1) break;
          this->index = this->index + 1;
          this->oldLength_ = newLen + 1 + this->oldLength_;
        }
        this->newLength_ = this->oldLength_;
        if (onlyChanges == '\0') {
          return '\x01';
        }
        updateNextIndexes(this);
        if (this->length <= this->index) {
          UVar2 = noNext(this);
          return UVar2;
        }
        this->index = this->index + 1;
      }
      this->changed = '\x01';
      if ((uint)newLen < 0x7000) {
        uVar4 = newLen >> 9 & 7;
        uVar5 = (newLen & 0x1ffU) + 1;
        if (this->coarse == '\0') {
          this->oldLength_ = newLen >> 0xc;
          this->newLength_ = uVar4;
          if (1 < uVar5) {
            this->remaining = uVar5;
          }
          return '\x01';
        }
        this->oldLength_ = uVar5 * (newLen >> 0xc);
        this->newLength_ = uVar5 * uVar4;
      }
      else {
        iVar3 = readLength(this,newLen >> 6 & 0x3f);
        this->oldLength_ = iVar3;
        iVar3 = readLength(this,newLen & 0x3f);
        this->newLength_ = iVar3;
        if (this->coarse == '\0') {
          return '\x01';
        }
      }
      while( true ) {
        bVar1 = false;
        if (this->index < this->length) {
          newLen = (int32_t)this->array[this->index];
          bVar1 = 0xfff < this->array[this->index];
        }
        if (!bVar1) break;
        this->index = this->index + 1;
        if ((uint)newLen < 0x7000) {
          iVar6 = (newLen & 0x1ffU) + 1;
          this->oldLength_ = (newLen >> 0xc) * iVar6 + this->oldLength_;
          this->newLength_ = (newLen >> 9 & 7U) * iVar6 + this->newLength_;
        }
        else {
          iVar3 = readLength(this,newLen >> 6 & 0x3f);
          this->oldLength_ = iVar3 + this->oldLength_;
          iVar3 = readLength(this,newLen & 0x3f);
          this->newLength_ = iVar3 + this->newLength_;
        }
      }
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = noNext(this);
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool Edits::Iterator::next(UBool onlyChanges, UErrorCode &errorCode) {
    // Forward iteration: Update the string indexes to the limit of the current span,
    // and post-increment-read array units to assemble a new span.
    // Leaves the array index one after the last unit of that span.
    if (U_FAILURE(errorCode)) { return FALSE; }
    // We have an errorCode in case we need to start guarding against integer overflows.
    // It is also convenient for caller loops if we bail out when an error was set elsewhere.
    if (dir > 0) {
        updateNextIndexes();
    } else {
        if (dir < 0) {
            // Turn around from previous() to next().
            // Post-increment-read the same span again.
            if (remaining > 0) {
                // Fine-grained iterator:
                // Stay on the current one of a sequence of compressed changes.
                ++index;  // next() rests on the index after the sequence unit.
                dir = 1;
                return TRUE;
            }
        }
        dir = 1;
    }
    if (remaining >= 1) {
        // Fine-grained iterator: Continue a sequence of compressed changes.
        if (remaining > 1) {
            --remaining;
            return TRUE;
        }
        remaining = 0;
    }
    if (index >= length) {
        return noNext();
    }
    int32_t u = array[index++];
    if (u <= MAX_UNCHANGED) {
        // Combine adjacent unchanged ranges.
        changed = FALSE;
        oldLength_ = u + 1;
        while (index < length && (u = array[index]) <= MAX_UNCHANGED) {
            ++index;
            oldLength_ += u + 1;
        }
        newLength_ = oldLength_;
        if (onlyChanges) {
            updateNextIndexes();
            if (index >= length) {
                return noNext();
            }
            // already fetched u > MAX_UNCHANGED at index
            ++index;
        } else {
            return TRUE;
        }
    }
    changed = TRUE;
    if (u <= MAX_SHORT_CHANGE) {
        int32_t oldLen = u >> 12;
        int32_t newLen = (u >> 9) & MAX_SHORT_CHANGE_NEW_LENGTH;
        int32_t num = (u & SHORT_CHANGE_NUM_MASK) + 1;
        if (coarse) {
            oldLength_ = num * oldLen;
            newLength_ = num * newLen;
        } else {
            // Split a sequence of changes that was compressed into one unit.
            oldLength_ = oldLen;
            newLength_ = newLen;
            if (num > 1) {
                remaining = num;  // This is the first of two or more changes.
            }
            return TRUE;
        }
    } else {
        U_ASSERT(u <= 0x7fff);
        oldLength_ = readLength((u >> 6) & 0x3f);
        newLength_ = readLength(u & 0x3f);
        if (!coarse) {
            return TRUE;
        }
    }
    // Combine adjacent changes.
    while (index < length && (u = array[index]) > MAX_UNCHANGED) {
        ++index;
        if (u <= MAX_SHORT_CHANGE) {
            int32_t num = (u & SHORT_CHANGE_NUM_MASK) + 1;
            oldLength_ += (u >> 12) * num;
            newLength_ += ((u >> 9) & MAX_SHORT_CHANGE_NEW_LENGTH) * num;
        } else {
            U_ASSERT(u <= 0x7fff);
            oldLength_ += readLength((u >> 6) & 0x3f);
            newLength_ += readLength(u & 0x3f);
        }
    }
    return TRUE;
}